

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::TestGroup::TestGroup(TestGroup *this,shared_ptr<Catch::Config> *config)

{
  __normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
  __last;
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  long in_RDI;
  pair<std::_Rb_tree_const_iterator<const_Catch::TestCase_*>,_bool> pVar4;
  FilterMatch *match;
  iterator __end3_1;
  iterator __begin3_1;
  Matches *__range3_1;
  TestCase *test;
  const_iterator __end3;
  const_iterator __begin3;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *__range3;
  vectorStrings *invalidArgs;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *allTestCases;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_fffffffffffffec8;
  __shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *in_stack_fffffffffffffed0;
  undefined7 in_stack_fffffffffffffed8;
  undefined1 in_stack_fffffffffffffedf;
  __normal_iterator<const_Catch::TestCase_*const_*,_std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>_>
  in_stack_fffffffffffffee0;
  TestCase **__args;
  IConfig *in_stack_ffffffffffffff38;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffff40;
  TestSpec *in_stack_ffffffffffffff48;
  __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
  local_a8;
  long local_a0;
  _Base_ptr local_98;
  undefined1 local_90;
  reference local_88;
  reference local_80;
  TestCase *local_78;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  in_stack_ffffffffffffff90;
  IConfigPtr *in_stack_ffffffffffffff98;
  RunContext *in_stack_ffffffffffffffa0;
  TestCase *local_58 [3];
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *local_40;
  shared_ptr<Catch::Config> *in_stack_ffffffffffffffd8;
  TestSpec *this_00;
  
  clara::std::shared_ptr<Catch::Config>::shared_ptr
            ((shared_ptr<Catch::Config> *)in_stack_fffffffffffffed0,
             (shared_ptr<Catch::Config> *)in_stack_fffffffffffffec8);
  std::shared_ptr<Catch::IConfig_const>::shared_ptr<Catch::Config,void>
            ((shared_ptr<const_Catch::IConfig> *)in_stack_fffffffffffffed0,
             (shared_ptr<Catch::Config> *)in_stack_fffffffffffffec8);
  makeReporter(in_stack_ffffffffffffffd8);
  RunContext::RunContext
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,
             (IStreamingReporterPtr *)in_stack_ffffffffffffff90._M_current);
  clara::std::unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
  ::~unique_ptr((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                 *)in_stack_fffffffffffffed0);
  clara::std::shared_ptr<const_Catch::IConfig>::~shared_ptr
            ((shared_ptr<const_Catch::IConfig> *)0x257bf9);
  clara::std::
  set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
  ::set((set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
         *)0x257c0f);
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
         0x257c25);
  clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffed0);
  local_40 = getAllTestCasesSorted((IConfig *)0x257c37);
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x257c55);
  (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator*(in_stack_fffffffffffffed0);
  TestSpec::matchesByFilter
            (in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  __args = local_58;
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  operator=((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
            in_stack_fffffffffffffee0._M_current,
            (vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
            CONCAT17(in_stack_fffffffffffffedf,in_stack_fffffffffffffed8));
  clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::
  ~vector((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          in_stack_fffffffffffffee0._M_current);
  peVar3 = clara::std::__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x257ccd);
  iVar2 = (*(peVar3->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xd])();
  this_00 = (TestSpec *)CONCAT44(extraout_var,iVar2);
  TestSpec::getInvalidArgs_abi_cxx11_(this_00);
  bVar1 = clara::std::
          vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::empty
                    ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                      *)in_stack_fffffffffffffee0._M_current);
  if ((bVar1) &&
     (bVar1 = clara::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffee0._M_current), bVar1)) {
    clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
              (in_stack_fffffffffffffec8);
    local_78 = (TestCase *)
               clara::std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end
                         (in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      local_80 = __gnu_cxx::
                 __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                 ::operator*((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                              *)&stack0xffffffffffffff90);
      bVar1 = TestCaseInfo::isHidden(&local_80->super_TestCaseInfo);
      if (!bVar1) {
        local_88 = local_80;
        pVar4 = std::
                set<Catch::TestCase_const*,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
                ::emplace<Catch::TestCase_const*>
                          ((set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
                            *)this_00,__args);
        local_98 = (_Base_ptr)pVar4.first._M_node;
        local_90 = pVar4.second;
      }
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator++((__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                    *)&stack0xffffffffffffff90);
    }
  }
  else {
    local_a0 = in_RDI + 0x230;
    local_a8._M_current =
         (FilterMatch *)
         clara::std::
         vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>::begin
                   ((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
                     *)in_stack_fffffffffffffec8);
    clara::std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>
    ::end((vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_> *)
          in_stack_fffffffffffffec8);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                               *)in_stack_fffffffffffffed0,
                              (__normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
                               *)in_stack_fffffffffffffec8), bVar1) {
      __gnu_cxx::
      __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
      ::operator*(&local_a8);
      in_stack_fffffffffffffed0 =
           (__shared_ptr_access<Catch::Config,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
           (in_RDI + 0x200);
      clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::begin
                ((vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> *)
                 in_stack_fffffffffffffec8);
      clara::std::vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_>::end
                ((vector<const_Catch::TestCase_*,_std::allocator<const_Catch::TestCase_*>_> *)
                 in_stack_fffffffffffffec8);
      __last._M_current._7_1_ = in_stack_fffffffffffffedf;
      __last._M_current._0_7_ = in_stack_fffffffffffffed8;
      std::
      set<Catch::TestCase_const*,std::less<Catch::TestCase_const*>,std::allocator<Catch::TestCase_const*>>
      ::
      insert<__gnu_cxx::__normal_iterator<Catch::TestCase_const*const*,std::vector<Catch::TestCase_const*,std::allocator<Catch::TestCase_const*>>>>
                ((set<const_Catch::TestCase_*,_std::less<const_Catch::TestCase_*>,_std::allocator<const_Catch::TestCase_*>_>
                  *)in_stack_fffffffffffffed0,in_stack_fffffffffffffee0,__last);
      __gnu_cxx::
      __normal_iterator<Catch::TestSpec::FilterMatch_*,_std::vector<Catch::TestSpec::FilterMatch,_std::allocator<Catch::TestSpec::FilterMatch>_>_>
      ::operator++(&local_a8);
    }
  }
  return;
}

Assistant:

explicit TestGroup(std::shared_ptr<Config> const& config)
            : m_config{config}
            , m_context{config, makeReporter(config)}
            {
                auto const& allTestCases = getAllTestCasesSorted(*m_config);
                m_matches = m_config->testSpec().matchesByFilter(allTestCases, *m_config);
                auto const& invalidArgs = m_config->testSpec().getInvalidArgs();

                if (m_matches.empty() && invalidArgs.empty()) {
                    for (auto const& test : allTestCases)
                        if (!test.isHidden())
                            m_tests.emplace(&test);
                } else {
                    for (auto const& match : m_matches)
                        m_tests.insert(match.tests.begin(), match.tests.end());
                }
            }